

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_callmsg.c
# Opt level: O1

_Bool xdr_call_decode(XDR *xdrs,rpc_msg *cmsg,int32_t *buf)

{
  uint uVar1;
  uint *puVar2;
  _Bool _Var3;
  uint *puVar4;
  undefined8 uVar5;
  uint uVar6;
  char *pcVar7;
  char local_2c [4];
  
  if (buf == (int32_t *)0x0) {
    if ((__ntirpc_pkg_params.debug_flags >> 0x19 & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u non-INLINE","xdr_call_decode",0xcb);
    }
    puVar4 = (uint *)((long)xdrs->x_data + 4);
    if ((xdrs->x_v).vio_tail < puVar4) {
      _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)&cmsg->ru);
      if (!_Var3) {
        if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar7 = "%s:%u ERROR rm_call.cb_rpcvers";
        uVar5 = 0xcf;
        goto LAB_0011206a;
      }
    }
    else {
      uVar1 = *(uint *)xdrs->x_data;
      (cmsg->ru).RM_cmb.cb_rpcvers =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      xdrs->x_data = (uint8_t *)puVar4;
    }
    puVar4 = (uint *)0x0;
  }
  else {
    if ((__ntirpc_pkg_params.debug_flags >> 0x19 & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u INLINE","xdr_call_decode",0xc6);
    }
    uVar1 = *buf;
    puVar4 = (uint *)(buf + 1);
    (cmsg->ru).RM_cmb.cb_rpcvers =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  uVar1 = (cmsg->ru).RM_cmb.cb_rpcvers;
  if (uVar1 != 2) {
    if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    (*__ntirpc_pkg_params.warnx_)
              ("%s:%u ERROR rm_call.cb_rpcvers %u != %u","xdr_call_decode",0xd6,(ulong)uVar1,2);
    return false;
  }
  if (puVar4 == (uint *)0x0) {
    puVar4 = (uint *)((long)xdrs->x_data + 4);
    if ((xdrs->x_v).vio_tail < puVar4) {
      _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,&cmsg->cb_prog);
      if (!_Var3) {
        if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar7 = "%s:%u ERROR cb_prog";
        uVar5 = 0xe2;
        goto LAB_0011206a;
      }
    }
    else {
      uVar1 = *(uint *)xdrs->x_data;
      cmsg->cb_prog =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      xdrs->x_data = (uint8_t *)puVar4;
    }
    puVar4 = (uint *)((long)xdrs->x_data + 4);
    if ((xdrs->x_v).vio_tail < puVar4) {
      _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,&cmsg->cb_vers);
      if (!_Var3) {
        if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar7 = "%s:%u ERROR cb_vers";
        uVar5 = 0xe7;
        goto LAB_0011206a;
      }
    }
    else {
      uVar1 = *(uint *)xdrs->x_data;
      cmsg->cb_vers =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      xdrs->x_data = (uint8_t *)puVar4;
    }
  }
  else {
    uVar1 = *puVar4;
    cmsg->cb_prog = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = puVar4[1];
    cmsg->cb_vers = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  puVar4 = (uint *)xdrs->x_data;
  puVar2 = (uint *)(xdrs->x_v).vio_tail;
  if (puVar2 < puVar4 + 3) {
    puVar4 = (uint *)0x0;
  }
  else {
    xdrs->x_data = (uint8_t *)(puVar4 + 3);
  }
  if (puVar4 == (uint *)0x0) {
    puVar4 = (uint *)((long)xdrs->x_data + 4);
    if (puVar2 < puVar4) {
      _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,&cmsg->cb_proc);
      if (!_Var3) {
        if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar7 = "%s:%u ERROR cb_proc";
        uVar5 = 0xf7;
        goto LAB_0011206a;
      }
    }
    else {
      uVar1 = *(uint *)xdrs->x_data;
      cmsg->cb_proc =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      xdrs->x_data = (uint8_t *)puVar4;
    }
    _Var3 = xdr_opaque_auth_decode(xdrs,&cmsg->cb_cred,(int32_t *)0x0);
    if (!_Var3) {
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar7 = "%s:%u ERROR (return)";
      uVar5 = 0xfc;
      goto LAB_0011206a;
    }
  }
  else {
    uVar1 = *puVar4;
    cmsg->cb_proc = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = puVar4[1];
    (cmsg->cb_cred).oa_flavor =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = puVar4[2];
    uVar6 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    (cmsg->cb_cred).oa_length = uVar6;
    if (uVar1 != 0) {
      if (uVar6 < 0x191) {
        _Var3 = (*xdrs->x_ops->x_getbytes)(xdrs,(cmsg->cb_cred).oa_body,uVar6);
        if (_Var3) {
          uVar1 = uVar1 >> 0x18 & 3;
          if ((uVar1 != 0) && (_Var3 = (*xdrs->x_ops->x_getbytes)(xdrs,local_2c,4 - uVar1), !_Var3))
          {
            if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
              (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR crud","xdr_opaque_decode",0x1c9);
            }
            if (!_Var3) goto LAB_0011204a;
          }
          goto LAB_00111fc0;
        }
        if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR opaque","xdr_opaque_decode",0x1b9);
        }
      }
      else if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)
                  ("%s:%u ERROR oa_length (%u) > %u","xdr_opaque_auth_decode_it",0x70,(ulong)uVar6,
                   400);
      }
LAB_0011204a:
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar7 = "%s:%u ERROR (return)";
      uVar5 = 0xf1;
      goto LAB_0011206a;
    }
  }
LAB_00111fc0:
  _Var3 = xdr_opaque_auth_decode(xdrs,&cmsg->cb_verf,(int32_t *)0x0);
  if (_Var3) {
    return true;
  }
  if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
    return false;
  }
  pcVar7 = "%s:%u ERROR (return)";
  uVar5 = 0x103;
LAB_0011206a:
  (*__ntirpc_pkg_params.warnx_)(pcVar7,"xdr_call_decode",uVar5);
  return false;
}

Assistant:

bool
xdr_call_decode(XDR *xdrs, struct rpc_msg *cmsg, int32_t *buf)
{
	if (buf != NULL) {
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u INLINE",
			__func__, __LINE__);
		cmsg->rm_call.cb_rpcvers = IXDR_GET_U_INT32(buf);
	} else {
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u non-INLINE",
			__func__, __LINE__);
		if (!xdr_getuint32(xdrs, &cmsg->rm_call.cb_rpcvers)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_call.cb_rpcvers",
				__func__, __LINE__);
			return (false);
		}
	}
	if (cmsg->rm_call.cb_rpcvers != RPC_MSG_VERSION) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR rm_call.cb_rpcvers %u != %u",
			__func__, __LINE__,
			cmsg->rm_call.cb_rpcvers,
			RPC_MSG_VERSION);
		return (false);
	}

	if (buf != NULL) {
		cmsg->cb_prog = IXDR_GET_U_INT32(buf);
		cmsg->cb_vers = IXDR_GET_U_INT32(buf);
	} else if (!xdr_getuint32(xdrs, &(cmsg->cb_prog))) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR cb_prog",
			__func__, __LINE__);
		return (false);
	} else if (!xdr_getuint32(xdrs, &(cmsg->cb_vers))) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR cb_vers",
			__func__, __LINE__);
		return (false);
	}

	buf = xdr_inline_decode(xdrs, 3 * BYTES_PER_XDR_UNIT);
	if (buf != NULL) {
		cmsg->cb_proc = IXDR_GET_U_INT32(buf);
		if (!xdr_opaque_auth_decode(xdrs, &(cmsg->cb_cred), buf)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR (return)",
				__func__, __LINE__);
			return (false);
		}
	} else if (!xdr_getuint32(xdrs, &(cmsg->cb_proc))) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR cb_proc",
			__func__, __LINE__);
		return (false);
	} else if (!xdr_opaque_auth_decode(xdrs, &(cmsg->cb_cred), NULL)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR (return)",
			__func__, __LINE__);
		return (false);
	}

	if (!xdr_opaque_auth_decode(xdrs, &(cmsg->cb_verf), NULL)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR (return)",
			__func__, __LINE__);
		return (false);
	}
	return (true);
}